

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_elements_confidentialtxout.cpp
# Opt level: O3

void __thiscall
ConfidentialTxOut_Constractor6_Test::TestBody(ConfidentialTxOut_Constractor6_Test *this)

{
  bool *pbVar1;
  undefined1 lhs [8];
  bool bVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar3;
  ulong uVar4;
  char *pcVar5;
  size_t sVar6;
  Amount AVar7;
  AssertionResult gtest_ar_1;
  AssertionResult gtest_ar_6;
  AssertionResult gtest_ar_2;
  AssertionResult gtest_ar;
  ConfidentialTxOut txout;
  ElementsConfidentialAddress address;
  undefined1 local_378 [8];
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  sStack_370;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_368;
  undefined1 local_350 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_340 [2];
  undefined1 local_318 [8];
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_310;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_308;
  ulong local_2f8;
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_2f0;
  int64_t local_2e8;
  Amount local_2e0;
  ConfidentialTxOut local_2d0;
  ElementsConfidentialAddress local_1d8;
  
  pbVar1 = &local_2d0.super_AbstractTxOut.value_.ignore_check_;
  local_2d0.super_AbstractTxOut._vptr_AbstractTxOut = (_func_int **)pbVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_2d0,
             "el1qqw3e3mk4ng3ks43mh54udznuekaadh9lgwef3mwgzrfzakmdwcvqqve2xzutyaf7vjcap67f28q90uxec2ve95g3rpu5crapcmfr2l9xl5jzazvcpysz"
             ,"");
  cfd::core::ElementsConfidentialAddress::ElementsConfidentialAddress
            (&local_1d8,(string *)&local_2d0);
  if (local_2d0.super_AbstractTxOut._vptr_AbstractTxOut != (_func_int **)pbVar1) {
    operator_delete(local_2d0.super_AbstractTxOut._vptr_AbstractTxOut,
                    local_2d0.super_AbstractTxOut.value_._8_8_ + 1);
  }
  AVar7 = cfd::core::Amount::CreateBySatoshiAmount(100000000);
  local_2e0.amount_ = AVar7.amount_;
  local_2e0.ignore_check_ = AVar7.ignore_check_;
  cfd::core::ConfidentialTxOut::ConfidentialTxOut(&local_2d0,&local_1d8,&exp_asset,&local_2e0);
  cfd::core::ConfidentialAssetId::ConfidentialAssetId
            ((ConfidentialAssetId *)local_350,&local_2d0.asset_);
  cfd::core::ConfidentialAssetId::GetHex_abi_cxx11_
            ((string *)local_378,(ConfidentialAssetId *)local_350);
  lhs = local_378;
  cfd::core::ConfidentialAssetId::GetHex_abi_cxx11_((string *)local_318,&exp_asset);
  testing::internal::CmpHelperSTREQ
            ((internal *)&local_2f8,"txout.GetAsset().GetHex().c_str()","exp_asset.GetHex().c_str()"
             ,(char *)lhs,(char *)local_318);
  if (local_318 != (undefined1  [8])&local_308) {
    operator_delete((void *)local_318,local_308._M_allocated_capacity + 1);
  }
  if (local_378 != (undefined1  [8])&local_368) {
    operator_delete((void *)local_378,local_368._M_allocated_capacity + 1);
  }
  local_350._0_8_ = &PTR__ConfidentialAssetId_007e7ad0;
  if ((pointer)local_350._8_8_ != (pointer)0x0) {
    operator_delete((void *)local_350._8_8_,local_340[0]._8_8_ - local_350._8_8_);
  }
  if (local_2f8._0_1_ == (internal)0x0) {
    testing::Message::Message((Message *)local_350);
    if (local_2f0.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
    {
      pcVar5 = "";
    }
    else {
      pcVar5 = ((local_2f0.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_378,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/test/test_elements_confidentialtxout.cpp"
               ,0xba,pcVar5);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_378,(Message *)local_350);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_378);
    if ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_350._0_8_
        != (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      bVar2 = testing::internal::IsTrue(true);
      if ((bVar2) &&
         ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_350._0_8_
          != (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
        (**(code **)(*(_func_int **)local_350._0_8_ + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_2f0,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  cfd::core::ConfidentialValue::ConfidentialValue
            ((ConfidentialValue *)local_350,&local_2d0.confidential_value_);
  AVar7 = cfd::core::ConfidentialValue::GetAmount((ConfidentialValue *)local_350);
  local_318 = (undefined1  [8])AVar7.amount_;
  local_310.ptr_._0_1_ = AVar7.ignore_check_;
  local_2f8 = cfd::core::Amount::GetSatoshiValue((Amount *)local_318);
  local_2e8 = cfd::core::Amount::GetSatoshiValue(&local_2e0);
  testing::internal::CmpHelperEQ<long,long>
            ((internal *)local_378,"txout.GetConfidentialValue().GetAmount().GetSatoshiValue()",
             "amount.GetSatoshiValue()",(long *)&local_2f8,&local_2e8);
  local_350._0_8_ = &PTR__ConfidentialValue_007e7aa0;
  if ((pointer)local_350._8_8_ != (pointer)0x0) {
    operator_delete((void *)local_350._8_8_,local_340[0]._8_8_ - local_350._8_8_);
  }
  if (local_378[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_350);
    if (sStack_370.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
    {
      pcVar5 = "";
    }
    else {
      pcVar5 = ((sStack_370.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_318,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/test/test_elements_confidentialtxout.cpp"
               ,0xbc,pcVar5);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_318,(Message *)local_350);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_318);
    if ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_350._0_8_
        != (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      bVar2 = testing::internal::IsTrue(true);
      if ((bVar2) &&
         ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_350._0_8_
          != (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
        (**(code **)(*(_func_int **)local_350._0_8_ + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&sStack_370,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  cfd::core::AbstractTxOut::GetLockingScript((Script *)local_350,&local_2d0.super_AbstractTxOut);
  cfd::core::Script::GetHex_abi_cxx11_((string *)local_378,(Script *)local_350);
  testing::internal::CmpHelperSTREQ
            ((internal *)local_318,"txout.GetLockingScript().GetHex().c_str()",
             "\"0020332a30b8b2753e64b1d0ebc951c057f0d9c29992d11118794c0fa1c6d2357ca6\"",
             (char *)local_378,
             "0020332a30b8b2753e64b1d0ebc951c057f0d9c29992d11118794c0fa1c6d2357ca6");
  if (local_378 != (undefined1  [8])&local_368) {
    operator_delete((void *)local_378,local_368._M_allocated_capacity + 1);
  }
  cfd::core::Script::~Script((Script *)local_350);
  if (local_318[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_350);
    if ((undefined8 *)CONCAT71(local_310.ptr_._1_7_,local_310.ptr_._0_1_) == (undefined8 *)0x0) {
      pcVar5 = "";
    }
    else {
      pcVar5 = *(char **)CONCAT71(local_310.ptr_._1_7_,local_310.ptr_._0_1_);
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_378,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/test/test_elements_confidentialtxout.cpp"
               ,0xbe,pcVar5);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_378,(Message *)local_350);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_378);
    if ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_350._0_8_
        != (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      bVar2 = testing::internal::IsTrue(true);
      if ((bVar2) &&
         ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_350._0_8_
          != (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
        (**(code **)(*(_func_int **)local_350._0_8_ + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_310,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  cfd::core::ConfidentialNonce::ConfidentialNonce((ConfidentialNonce *)local_350,&local_2d0.nonce_);
  cfd::core::ConfidentialNonce::GetHex_abi_cxx11_
            ((string *)local_378,(ConfidentialNonce *)local_350);
  testing::internal::CmpHelperSTREQ
            ((internal *)local_318,"txout.GetNonce().GetHex().c_str()",
             "\"03a398eed59a2368563bbd2bc68a7ccdbbd6dcbf43b298edc810d22edb6d761800\"",
             (char *)local_378,"03a398eed59a2368563bbd2bc68a7ccdbbd6dcbf43b298edc810d22edb6d761800")
  ;
  if (local_378 != (undefined1  [8])&local_368) {
    operator_delete((void *)local_378,local_368._M_allocated_capacity + 1);
  }
  local_350._0_8_ = &PTR__ConfidentialNonce_007e7a70;
  if ((pointer)local_350._8_8_ != (pointer)0x0) {
    operator_delete((void *)local_350._8_8_,local_340[0]._8_8_ - local_350._8_8_);
  }
  if (local_318[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_350);
    if ((undefined8 *)CONCAT71(local_310.ptr_._1_7_,local_310.ptr_._0_1_) == (undefined8 *)0x0) {
      pcVar5 = "";
    }
    else {
      pcVar5 = *(char **)CONCAT71(local_310.ptr_._1_7_,local_310.ptr_._0_1_);
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_378,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/test/test_elements_confidentialtxout.cpp"
               ,0xc0,pcVar5);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_378,(Message *)local_350);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_378);
    if ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_350._0_8_
        != (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      bVar2 = testing::internal::IsTrue(true);
      if ((bVar2) &&
         ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_350._0_8_
          != (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
        (**(code **)(*(_func_int **)local_350._0_8_ + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_310,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_378 = (undefined1  [8])0x0;
  sStack_370.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  local_368._M_allocated_capacity = 0;
  uVar4 = (long)local_2d0.range_proof_.data_.
                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_finish -
          (long)local_2d0.range_proof_.data_.
                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_start;
  if (uVar4 == 0) {
    pbVar3 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    sVar6 = 0;
  }
  else {
    if ((long)uVar4 < 0) {
      std::__throw_bad_alloc();
    }
    pbVar3 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             operator_new(uVar4);
    sVar6 = (long)local_2d0.range_proof_.data_.
                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                  super__Vector_impl_data._M_finish -
            (long)local_2d0.range_proof_.data_.
                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                  super__Vector_impl_data._M_start;
  }
  local_368._M_allocated_capacity = uVar4 + (long)pbVar3;
  local_378 = (undefined1  [8])pbVar3;
  if (local_2d0.range_proof_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
      ._M_impl.super__Vector_impl_data._M_finish !=
      local_2d0.range_proof_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
      ._M_impl.super__Vector_impl_data._M_start) {
    sStack_370.ptr_ = pbVar3;
    memmove(pbVar3,local_2d0.range_proof_.data_.
                   super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                   super__Vector_impl_data._M_start,sVar6);
  }
  sStack_370.ptr_ =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
       ((long)&(pbVar3->_M_dataplus)._M_p + sVar6);
  cfd::core::ByteData::GetHex_abi_cxx11_((string *)local_350,(ByteData *)local_378);
  pcVar5 = "";
  testing::internal::CmpHelperSTREQ
            ((internal *)local_318,"txout.GetRangeProof().GetHex().c_str()","\"\"",
             (char *)local_350._0_8_,"");
  if ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_350._0_8_ !=
      (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)(local_350 + 0x10))
  {
    operator_delete((void *)local_350._0_8_,(ulong)(local_340[0]._M_allocated_capacity + 1));
  }
  if (local_378 != (undefined1  [8])0x0) {
    operator_delete((void *)local_378,local_368._M_allocated_capacity - (long)local_378);
  }
  if (local_318[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_350);
    if ((undefined8 *)CONCAT71(local_310.ptr_._1_7_,local_310.ptr_._0_1_) != (undefined8 *)0x0) {
      pcVar5 = *(char **)CONCAT71(local_310.ptr_._1_7_,local_310.ptr_._0_1_);
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_378,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/test/test_elements_confidentialtxout.cpp"
               ,0xc1,pcVar5);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_378,(Message *)local_350);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_378);
    if ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_350._0_8_
        != (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      bVar2 = testing::internal::IsTrue(true);
      if ((bVar2) &&
         ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_350._0_8_
          != (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
        (**(code **)(*(_func_int **)local_350._0_8_ + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_310,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_378 = (undefined1  [8])0x0;
  sStack_370.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  local_368._M_allocated_capacity = 0;
  uVar4 = (long)local_2d0.surjection_proof_.data_.
                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_finish -
          (long)local_2d0.surjection_proof_.data_.
                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_start;
  if (uVar4 == 0) {
    pbVar3 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    sVar6 = 0;
  }
  else {
    if ((long)uVar4 < 0) {
      std::__throw_bad_alloc();
    }
    pbVar3 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             operator_new(uVar4);
    sVar6 = (long)local_2d0.surjection_proof_.data_.
                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                  super__Vector_impl_data._M_finish -
            (long)local_2d0.surjection_proof_.data_.
                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                  super__Vector_impl_data._M_start;
  }
  local_368._M_allocated_capacity = uVar4 + (long)pbVar3;
  local_378 = (undefined1  [8])pbVar3;
  if (local_2d0.surjection_proof_.data_.
      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_finish !=
      local_2d0.surjection_proof_.data_.
      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start) {
    sStack_370.ptr_ = pbVar3;
    memmove(pbVar3,local_2d0.surjection_proof_.data_.
                   super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                   super__Vector_impl_data._M_start,sVar6);
  }
  sStack_370.ptr_ =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
       ((long)&(pbVar3->_M_dataplus)._M_p + sVar6);
  cfd::core::ByteData::GetHex_abi_cxx11_((string *)local_350,(ByteData *)local_378);
  pcVar5 = "";
  testing::internal::CmpHelperSTREQ
            ((internal *)local_318,"txout.GetSurjectionProof().GetHex().c_str()","\"\"",
             (char *)local_350._0_8_,"");
  if ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_350._0_8_ !=
      (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)(local_350 + 0x10))
  {
    operator_delete((void *)local_350._0_8_,(ulong)(local_340[0]._M_allocated_capacity + 1));
  }
  if (local_378 != (undefined1  [8])0x0) {
    operator_delete((void *)local_378,local_368._M_allocated_capacity - (long)local_378);
  }
  if (local_318[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_350);
    if ((undefined8 *)CONCAT71(local_310.ptr_._1_7_,local_310.ptr_._0_1_) != (undefined8 *)0x0) {
      pcVar5 = *(char **)CONCAT71(local_310.ptr_._1_7_,local_310.ptr_._0_1_);
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_378,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/test/test_elements_confidentialtxout.cpp"
               ,0xc2,pcVar5);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_378,(Message *)local_350);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_378);
    if ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_350._0_8_
        != (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      bVar2 = testing::internal::IsTrue(true);
      if ((bVar2) &&
         ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_350._0_8_
          != (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
        (**(code **)(*(_func_int **)local_350._0_8_ + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_310,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  AVar7 = cfd::core::AbstractTxOut::GetValue(&local_2d0.super_AbstractTxOut);
  local_378 = (undefined1  [8])AVar7.amount_;
  sStack_370.ptr_._0_1_ = AVar7.ignore_check_;
  local_318 = (undefined1  [8])cfd::core::Amount::GetSatoshiValue((Amount *)local_378);
  local_2f8 = local_2f8 & 0xffffffff00000000;
  testing::internal::CmpHelperEQ<long,int>
            ((internal *)local_350,"txout.GetValue().GetSatoshiValue()","0",(long *)local_318,
             (int *)&local_2f8);
  if (local_350[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_378);
    if ((pointer)local_350._8_8_ == (pointer)0x0) {
      pcVar5 = "";
    }
    else {
      pcVar5 = *(char **)local_350._8_8_;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_318,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/test/test_elements_confidentialtxout.cpp"
               ,0xc3,pcVar5);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_318,(Message *)local_378);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_318);
    if (local_378 != (undefined1  [8])0x0) {
      bVar2 = testing::internal::IsTrue(true);
      if ((bVar2) && (local_378 != (undefined1  [8])0x0)) {
        (**(code **)(*(long *)local_378 + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)(local_350 + 8),(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
  ;
  cfd::core::ConfidentialTxOut::~ConfidentialTxOut(&local_2d0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1d8.address_._M_dataplus._M_p != &local_1d8.address_.field_2) {
    operator_delete(local_1d8.address_._M_dataplus._M_p,
                    local_1d8.address_.field_2._M_allocated_capacity + 1);
  }
  if (local_1d8.confidential_key_.data_.data_.
      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_1d8.confidential_key_.data_.data_.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_1d8.confidential_key_.data_.data_.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_1d8.confidential_key_.data_.data_.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  cfd::core::Address::~Address(&local_1d8.unblinded_address_);
  return;
}

Assistant:

TEST(ConfidentialTxOut, Setter) {
  ConfidentialTxOut txout;

  EXPECT_STREQ(txout.GetAsset().GetHex().c_str(), "");
  EXPECT_STREQ(txout.GetConfidentialValue().GetHex().c_str(), "");
  EXPECT_STREQ(txout.GetLockingScript().GetHex().c_str(), "");
  EXPECT_STREQ(txout.GetNonce().GetHex().c_str(), "");
  EXPECT_STREQ(txout.GetRangeProof().GetHex().c_str(), "");
  EXPECT_STREQ(txout.GetSurjectionProof().GetHex().c_str(), "");
  EXPECT_EQ(txout.GetValue().GetSatoshiValue(), 0);
  EXPECT_STREQ(txout.GetWitnessHash().GetHex().c_str(),
    "7d993a3ac51b76589a07c59078e2e4241f4c13c5190a763f22213e0c9ed8e7d5");

  txout.SetValue(Amount::CreateBySatoshiAmount(100000000));

  EXPECT_STREQ(txout.GetAsset().GetHex().c_str(), "");
  EXPECT_STREQ(txout.GetConfidentialValue().GetHex().c_str(),
      "010000000005f5e100");
  EXPECT_STREQ(txout.GetLockingScript().GetHex().c_str(), "");
  EXPECT_STREQ(txout.GetNonce().GetHex().c_str(), "");
  EXPECT_STREQ(txout.GetRangeProof().GetHex().c_str(), "");
  EXPECT_STREQ(txout.GetSurjectionProof().GetHex().c_str(), "");
  EXPECT_EQ(txout.GetValue().GetSatoshiValue(), 100000000);

  txout.SetCommitment(exp_asset, exp_value, exp_nonce, exp_surjection_proof,
                      exp_range_proof);
  EXPECT_STREQ(txout.GetWitnessHash().GetHex().c_str(),
    "51e1922fa92165e1705155a1973d9c3b78cbc253ec185f58a4d53a59b3eee093");

  EXPECT_STREQ(txout.GetAsset().GetHex().c_str(), exp_asset.GetHex().c_str());
  EXPECT_STREQ(txout.GetConfidentialValue().GetHex().c_str(),
               exp_value.GetHex().c_str());
  EXPECT_STREQ(txout.GetLockingScript().GetHex().c_str(), "");
  EXPECT_STREQ(txout.GetNonce().GetHex().c_str(), exp_nonce.GetHex().c_str());
  EXPECT_STREQ(txout.GetRangeProof().GetHex().c_str(),
               exp_range_proof.GetHex().c_str());
  EXPECT_STREQ(txout.GetSurjectionProof().GetHex().c_str(),
               exp_surjection_proof.GetHex().c_str());
  EXPECT_EQ(txout.GetValue().GetSatoshiValue(), 100000000);

  ConfidentialTxOutReference txout_ref(txout);
  EXPECT_STREQ(txout_ref.GetAsset().GetHex().c_str(),
               exp_asset.GetHex().c_str());
  EXPECT_STREQ(txout_ref.GetConfidentialValue().GetHex().c_str(),
               exp_value.GetHex().c_str());
  EXPECT_STREQ(txout_ref.GetLockingScript().GetHex().c_str(), "");
  EXPECT_STREQ(txout_ref.GetNonce().GetHex().c_str(),
               exp_nonce.GetHex().c_str());
  EXPECT_STREQ(txout_ref.GetRangeProof().GetHex().c_str(),
               exp_range_proof.GetHex().c_str());
  EXPECT_STREQ(txout_ref.GetSurjectionProof().GetHex().c_str(),
               exp_surjection_proof.GetHex().c_str());
  EXPECT_EQ(txout_ref.GetValue().GetSatoshiValue(), 100000000);
}